

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HighsSolutionDebug.cpp
# Opt level: O2

HighsDebugStatus debugHighsLpSolution(string *message,HighsLpSolverObject *solver_object)

{
  HighsDebugStatus HVar1;
  string local_80;
  HighsHessian hessian;
  
  HighsHessian::HighsHessian(&hessian);
  std::__cxx11::string::string((string *)&local_80,(string *)message);
  HVar1 = debugHighsSolution(&local_80,solver_object->options_,solver_object->lp_,&hessian,
                             solver_object->solution_,solver_object->basis_,
                             solver_object->model_status_,solver_object->highs_info_,true);
  std::__cxx11::string::~string((string *)&local_80);
  HighsHessian::~HighsHessian(&hessian);
  return HVar1;
}

Assistant:

HighsDebugStatus debugHighsLpSolution(
    const std::string message, const HighsLpSolverObject& solver_object) {
  // Non-trivially expensive analysis of a solution to a model
  //
  // Called to check the unscaled model status and solution params
  const bool check_model_status_and_highs_info = true;
  // Define an empty Hessian
  HighsHessian hessian;
  return debugHighsSolution(message, solver_object.options_, solver_object.lp_,
                            hessian, solver_object.solution_,
                            solver_object.basis_, solver_object.model_status_,
                            solver_object.highs_info_,
                            check_model_status_and_highs_info);
}